

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::StartAt(LocationRecorder *this,Token *token)

{
  int iVar1;
  pointer piVar2;
  
  iVar1 = token->line;
  piVar2 = RepeatedField<int>::Mutable(&(this->location_->field_0)._impl_.span_,0);
  *piVar2 = iVar1;
  iVar1 = token->column;
  piVar2 = RepeatedField<int>::Mutable(&(this->location_->field_0)._impl_.span_,1);
  *piVar2 = iVar1;
  return;
}

Assistant:

void Parser::LocationRecorder::StartAt(const io::Tokenizer::Token& token) {
  location_->set_span(0, token.line);
  location_->set_span(1, token.column);
}